

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_xsxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 ret;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uintptr_t o;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)ts - (long)s);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i64)((long)ts_00 - (long)s);
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    c2 = tcg_const_i64_ppc64(s,0);
    c2_00 = tcg_const_i64_ppc64(s,0x7ff);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_extract_i64_ppc64(s,ret_00,(TCGv_i64)((long)ts_01 - (long)s),0x34,0xb);
    tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)ts_00,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret_01,ret_00,c2,c2,ret_01);
    tcg_gen_movcond_i64_ppc64(s,TCG_COND_EQ,ret_01,ret_00,c2_00,c2,ret_01);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_deposit_i64_ppc64(s,ret,ret_01,(TCGv_i64)((long)ts_01 - (long)s),0,0x34);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(c2_00 + (long)s));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xsxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv rt = cpu_gpr[rD(ctx->opcode)];
    TCGv_i64 t0, t1, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_extract_i64(tcg_ctx, exp, t1, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_deposit_i64(tcg_ctx, rt, t0, t1, 0, 52);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
}